

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_comm.cpp
# Opt level: O1

CommPtr __thiscall Omega_h::Comm::graph(Comm *this,Read<int> *dsts)

{
  ulong *puVar1;
  Library *this_00;
  ulong uVar2;
  ulong *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  CommPtr CVar3;
  
  this_00 = (Library *)operator_new(0x50);
  puVar1 = (ulong *)*in_RDX;
  if (((ulong)puVar1 & 1) == 0) {
    uVar2 = *puVar1;
  }
  else {
    uVar2 = (ulong)puVar1 >> 3;
  }
  Comm((Comm *)this_00,(Library *)(dsts->write_).shared_alloc_.alloc,true,(uVar2 & 0x3fffffffc) == 4
      );
  this->library_ = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Omega_h::Comm*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->srcs_,(Comm *)this_00);
  CVar3.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar3.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (CommPtr)CVar3.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

CommPtr Comm::graph(Read<I32> dsts) const {
#ifdef OMEGA_H_USE_MPI
  HostRead<I32> h_destinations(dsts);
  auto v_sources = sources_from_destinations(impl_, h_destinations);
  HostWrite<I32> h_sources(int(v_sources.size()));
  for (int i = 0; i < h_sources.size(); ++i)
    h_sources[i] = v_sources[std::size_t(i)];
  MPI_Comm impl2;
  CALL(MPI_Comm_dup(impl_, &impl2));
  return CommPtr(new Comm(library_, impl2, h_sources.write(), dsts));
#else
  return CommPtr(new Comm(library_, true, dsts.size() == 1));
#endif
}